

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.cc
# Opt level: O2

void __thiscall SleighBase::saveXml(SleighBase *this,ostream *s)

{
  pointer ppAVar1;
  AddrSpace *pAVar2;
  int4 i;
  long lVar3;
  allocator local_41;
  string local_40;
  
  std::operator<<(s,"<sleigh");
  std::__cxx11::string::string((string *)&local_40,"version",&local_41);
  a_v_i(s,&local_40,2);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"bigendian",&local_41);
  a_v_b(s,&local_40,(this->super_Translate).target_isbigendian);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"align",&local_41);
  a_v_i(s,&local_40,(long)(this->super_Translate).alignment);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"uniqbase",&local_41);
  a_v_u(s,&local_40,(ulong)(this->super_Translate).unique_base);
  std::__cxx11::string::~string((string *)&local_40);
  if (this->maxdelayslotbytes != 0) {
    std::__cxx11::string::string((string *)&local_40,"maxdelay",&local_41);
    a_v_u(s,&local_40,(ulong)this->maxdelayslotbytes);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (this->unique_allocatemask != 0) {
    std::__cxx11::string::string((string *)&local_40,"uniqmask",&local_41);
    a_v_u(s,&local_40,(ulong)this->unique_allocatemask);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (this->numSections != 0) {
    std::__cxx11::string::string((string *)&local_40,"numsections",&local_41);
    a_v_u(s,&local_40,(ulong)this->numSections);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(s,">\n");
  std::operator<<(s,"<spaces");
  std::__cxx11::string::string((string *)&local_40,"defaultspace",&local_41);
  a_v(s,&local_40,&((this->super_Translate).super_AddrSpaceManager.defaultspace)->name);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(s,">\n");
  lVar3 = 0;
  while( true ) {
    ppAVar1 = (this->super_Translate).super_AddrSpaceManager.baselist.
              super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->super_Translate).super_AddrSpaceManager.baselist.
                            super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3) <= lVar3)
    break;
    pAVar2 = ppAVar1[lVar3];
    if ((pAVar2 != (AddrSpace *)0x0) &&
       ((IPTR_JOIN < pAVar2->type || ((0x71U >> (pAVar2->type & 0x1f) & 1) == 0)))) {
      (*pAVar2->_vptr_AddrSpace[0xc])(pAVar2,s);
    }
    lVar3 = lVar3 + 1;
  }
  std::operator<<(s,"</spaces>\n");
  SymbolTable::saveXml(&this->symtab,s);
  std::operator<<(s,"</sleigh>\n");
  return;
}

Assistant:

void SleighBase::saveXml(ostream &s) const

{
  s << "<sleigh";
  a_v_i(s,"version",SLA_FORMAT_VERSION);
  a_v_b(s,"bigendian",isBigEndian());
  a_v_i(s,"align",alignment);
  a_v_u(s,"uniqbase",getUniqueBase());
  if (maxdelayslotbytes > 0)
    a_v_u(s,"maxdelay",maxdelayslotbytes);
  if (unique_allocatemask != 0)
    a_v_u(s,"uniqmask",unique_allocatemask);
  if (numSections != 0)
    a_v_u(s,"numsections",numSections);
  s << ">\n";

  s << "<spaces";
  a_v(s,"defaultspace",getDefaultSpace()->getName());
  s << ">\n";
  for(int4 i=0;i<numSpaces();++i) {
    AddrSpace *spc = getSpace(i);
    if (spc == (AddrSpace *)0) continue;
    if ((spc->getType()==IPTR_CONSTANT) || 
	(spc->getType()==IPTR_FSPEC)||
	(spc->getType()==IPTR_IOP)||
	(spc->getType()==IPTR_JOIN))
      continue;
    spc->saveXml(s);
  }
  s << "</spaces>\n";
  symtab.saveXml(s);
  s << "</sleigh>\n";
}